

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

mat44 * nifti_mat44_inverse(mat44 R)

{
  float fVar1;
  float fVar2;
  mat44 *in_RDI;
  float in_stack_00000008;
  float in_stack_0000000c;
  double deti;
  double v3;
  double v2;
  double v1;
  double r33;
  double r32;
  double r31;
  double r23;
  double r22;
  double r21;
  double r13;
  double r12;
  double r11;
  
  fVar2 = (R.m[1][2] * in_stack_0000000c * R.m[1][0] +
          R.m[0][2] * R.m[1][3] * R.m[0][0] +
          ((in_stack_00000008 * R.m[0][3] * R.m[2][0] - in_stack_00000008 * R.m[1][3] * R.m[1][0]) -
          R.m[0][2] * in_stack_0000000c * R.m[2][0])) - R.m[1][2] * R.m[0][3] * R.m[0][0];
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = 1.0 / fVar2;
  }
  in_RDI->m[0][0] = fVar2 * (R.m[0][3] * R.m[2][0] - R.m[1][3] * R.m[1][0]);
  in_RDI->m[0][1] = fVar2 * (R.m[1][3] * R.m[0][0] - in_stack_0000000c * R.m[2][0]);
  in_RDI->m[0][2] = fVar2 * (in_stack_0000000c * R.m[1][0] - R.m[0][3] * R.m[0][0]);
  in_RDI->m[0][3] =
       fVar2 * (R.m[1][3] * R.m[0][1] * R.m[1][0] +
               (((R.m[0][3] * R.m[0][0] * R.m[2][1] +
                 (in_stack_0000000c * R.m[1][1] * R.m[2][0] -
                 in_stack_0000000c * R.m[1][0] * R.m[2][1])) - R.m[0][3] * R.m[0][1] * R.m[2][0]) -
               R.m[1][3] * R.m[0][0] * R.m[1][1]));
  in_RDI->m[1][0] = fVar2 * (R.m[1][2] * R.m[1][0] - R.m[0][2] * R.m[2][0]);
  in_RDI->m[1][1] = fVar2 * (in_stack_00000008 * R.m[2][0] - R.m[1][2] * R.m[0][0]);
  in_RDI->m[1][2] = fVar2 * (R.m[0][2] * R.m[0][0] - in_stack_00000008 * R.m[1][0]);
  in_RDI->m[1][3] =
       fVar2 * ((R.m[1][2] * R.m[0][0] * R.m[1][1] +
                R.m[0][2] * R.m[0][1] * R.m[2][0] +
                ((in_stack_00000008 * R.m[1][0] * R.m[2][1] -
                 in_stack_00000008 * R.m[1][1] * R.m[2][0]) - R.m[0][2] * R.m[0][0] * R.m[2][1])) -
               R.m[1][2] * R.m[0][1] * R.m[1][0]);
  in_RDI->m[2][0] = fVar2 * (R.m[0][2] * R.m[1][3] - R.m[1][2] * R.m[0][3]);
  in_RDI->m[2][1] = fVar2 * (R.m[1][2] * in_stack_0000000c - in_stack_00000008 * R.m[1][3]);
  in_RDI->m[2][2] = fVar2 * (in_stack_00000008 * R.m[0][3] - R.m[0][2] * in_stack_0000000c);
  in_RDI->m[2][3] =
       fVar2 * (R.m[1][2] * R.m[0][3] * R.m[0][1] +
               (((R.m[0][2] * in_stack_0000000c * R.m[2][1] +
                 (in_stack_00000008 * R.m[1][3] * R.m[1][1] -
                 in_stack_00000008 * R.m[0][3] * R.m[2][1])) - R.m[0][2] * R.m[1][3] * R.m[0][1]) -
               R.m[1][2] * in_stack_0000000c * R.m[1][1]));
  in_RDI->m[3][2] = 0.0;
  in_RDI->m[3][1] = 0.0;
  in_RDI->m[3][0] = 0.0;
  fVar1 = 0.0;
  if (fVar2 != 0.0) {
    fVar1 = 1.0;
  }
  if (NAN(fVar2)) {
    fVar1 = 1.0;
  }
  in_RDI->m[3][3] = fVar1;
  return in_RDI;
}

Assistant:

mat44 nifti_mat44_inverse( mat44 R )
{
   double r11,r12,r13,r21,r22,r23,r31,r32,r33,v1,v2,v3 , deti ;
   mat44 Q ;
                                                       /*  INPUT MATRIX IS:  */
   r11 = R.m[0][0]; r12 = R.m[0][1]; r13 = R.m[0][2];  /* [ r11 r12 r13 v1 ] */
   r21 = R.m[1][0]; r22 = R.m[1][1]; r23 = R.m[1][2];  /* [ r21 r22 r23 v2 ] */
   r31 = R.m[2][0]; r32 = R.m[2][1]; r33 = R.m[2][2];  /* [ r31 r32 r33 v3 ] */
   v1  = R.m[0][3]; v2  = R.m[1][3]; v3  = R.m[2][3];  /* [  0   0   0   1 ] */

   deti = r11*r22*r33-r11*r32*r23-r21*r12*r33
         +r21*r32*r13+r31*r12*r23-r31*r22*r13 ;

   if( deti != 0.0l ) deti = 1.0l / deti ;

   Q.m[0][0] = (float)( deti*( r22*r33-r32*r23) ) ;
   Q.m[0][1] = (float)( deti*(-r12*r33+r32*r13) ) ;
   Q.m[0][2] = (float)( deti*( r12*r23-r22*r13) ) ;
   Q.m[0][3] = (float)( deti*(-r12*r23*v3+r12*v2*r33+r22*r13*v3
                     -r22*v1*r33-r32*r13*v2+r32*v1*r23) ) ;

   Q.m[1][0] = (float)( deti*(-r21*r33+r31*r23) ) ;
   Q.m[1][1] = (float)( deti*( r11*r33-r31*r13) ) ;
   Q.m[1][2] = (float)( deti*(-r11*r23+r21*r13) ) ;
   Q.m[1][3] = (float)( deti*( r11*r23*v3-r11*v2*r33-r21*r13*v3
                     +r21*v1*r33+r31*r13*v2-r31*v1*r23) ) ;

   Q.m[2][0] = (float)( deti*( r21*r32-r31*r22) ) ;
   Q.m[2][1] = (float)( deti*(-r11*r32+r31*r12) ) ;
   Q.m[2][2] = (float)( deti*( r11*r22-r21*r12) ) ;
   Q.m[2][3] = (float)( deti*(-r11*r22*v3+r11*r32*v2+r21*r12*v3
                     -r21*r32*v1-r31*r12*v2+r31*r22*v1) ) ;

   Q.m[3][0] = Q.m[3][1] = Q.m[3][2] = 0.0l ;
   Q.m[3][3] = (deti == 0.0l) ? 0.0l : 1.0l ; /* failure flag if deti == 0 */

   return Q ;
}